

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

int iSplitByDep(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,Vec_Int_t **iMatch,int *iGroup,int *iLastItem,
               int *oGroup)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  bool bVar19;
  
  iVar9 = *iLastItem;
  if (iVar9 < 1) {
    iVar15 = 0;
  }
  else {
    lVar17 = 0;
    iVar15 = 0;
    do {
      iVar9 = iMatch[lVar17]->nSize;
      if (iVar9 != 1) {
        p = (Vec_Int_t *)malloc(0x10);
        if (iVar9 - 1U < 0xf) {
          iVar9 = 0x10;
        }
        p->nSize = 0;
        p->nCap = iVar9;
        if (iVar9 == 0) {
          piVar3 = (int *)0x0;
        }
        else {
          piVar3 = (int *)malloc((long)iVar9 * 4);
        }
        p->pArray = piVar3;
        p_00 = (Vec_Int_t *)malloc(0x10);
        p_00->nSize = 0;
        p_00->nCap = iVar9;
        if (iVar9 == 0) {
          piVar3 = (int *)0x0;
        }
        else {
          piVar3 = (int *)malloc((long)iVar9 << 2);
        }
        p_00->pArray = piVar3;
        pVVar4 = iMatch[lVar17];
        bVar19 = 0 < pVVar4->nSize;
        if (0 < pVVar4->nSize) {
          lVar16 = 0;
          do {
            if (!bVar19) {
LAB_00297db5:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar1 = iDep[pVVar4->pArray[lVar16]]->nSize;
            uVar11 = 0;
            uVar7 = (ulong)uVar1;
            if ((int)uVar1 < 1) {
              uVar7 = uVar11;
            }
            iVar9 = 0;
            while (uVar7 != uVar11) {
              iVar9 = iVar9 + oGroup[iDep[pVVar4->pArray[lVar16]]->pArray[uVar11]];
              uVar11 = uVar11 + 1;
              if (!bVar19) goto LAB_00297db5;
            }
            Vec_IntPush(p,iVar9);
            if (0 < (long)p_00->nSize) {
              lVar8 = 0;
              do {
                if (p_00->pArray[lVar8] == iVar9) goto LAB_00297abc;
                lVar8 = lVar8 + 1;
              } while (p_00->nSize != lVar8);
            }
            Vec_IntPushOrder(p_00,iVar9);
LAB_00297abc:
            lVar16 = lVar16 + 1;
            pVVar4 = iMatch[lVar17];
            bVar19 = lVar16 < pVVar4->nSize;
          } while (lVar16 < pVVar4->nSize);
        }
        lVar16 = (long)p_00->nSize;
        if (1 < lVar16) {
          iVar9 = iVar15 + p_00->nSize;
          do {
            pVVar4 = iMatch[lVar17];
            if (0 < pVVar4->nSize) {
              uVar7 = 0;
              do {
                iVar18 = (int)uVar7;
                iVar2 = (int)lVar16;
                if (iVar18 < 0) {
LAB_00297da2:
                  p_00->nSize = iVar2;
                  goto LAB_00297db5;
                }
                uVar1 = p->nSize;
                if ((int)uVar1 <= iVar18) goto LAB_00297da2;
                piVar3 = p->pArray;
                if (piVar3[uVar7] == p_00->pArray[lVar16 + -1]) {
                  Vec_IntPush(iMatch[(long)iVar15 + (long)*iLastItem],pVVar4->pArray[uVar7]);
                  pVVar4 = iMatch[lVar17];
                  if (iVar18 < pVVar4->nSize) {
                    piVar6 = pVVar4->pArray;
                    iGroup[piVar6[uVar7]] = *iLastItem + iVar15;
                    uVar5 = pVVar4->nSize;
                    if (iVar18 < (int)uVar5) {
                      uVar11 = 0;
                      bVar19 = 0 < (int)uVar5;
                      if (0 < (int)uVar5) {
                        bVar19 = true;
                        if (*piVar6 != piVar6[uVar7]) {
                          uVar12 = 0;
                          do {
                            if ((ulong)uVar5 - 1 == uVar12) {
                              bVar19 = false;
                              uVar11 = (ulong)uVar5;
                              goto LAB_00297c00;
                            }
                            uVar11 = uVar12 + 1;
                            lVar8 = uVar12 + 1;
                            uVar12 = uVar11;
                          } while (piVar6[lVar8] != piVar6[uVar7]);
                          bVar19 = uVar11 < uVar5;
                        }
                      }
LAB_00297c00:
                      if ((uint)uVar11 != uVar5) {
                        if (!bVar19) {
                          p_00->nSize = iVar2;
                          goto LAB_00297de2;
                        }
                        uVar13 = (uint)uVar11 + 1;
                        if ((int)uVar13 < (int)uVar5) {
                          piVar14 = piVar6 + uVar13;
                          do {
                            iVar10 = (int)uVar11;
                            piVar6[uVar11 & 0xffffffff] = *piVar14;
                            uVar5 = pVVar4->nSize;
                            piVar14 = piVar14 + 1;
                            uVar11 = (ulong)(iVar10 + 1);
                          } while (iVar10 + 2 < (int)uVar5);
                        }
                        pVVar4->nSize = uVar5 - 1;
                      }
                      uVar11 = 0;
                      bVar19 = 0 < (int)uVar1;
                      if (0 < (int)uVar1) {
                        bVar19 = true;
                        uVar11 = 0;
                        if (*piVar3 != piVar3[uVar7]) {
                          uVar12 = 0;
                          do {
                            if ((ulong)uVar1 - 1 == uVar12) {
                              bVar19 = false;
                              uVar11 = (ulong)uVar1;
                              goto LAB_00297cab;
                            }
                            uVar11 = uVar12 + 1;
                            lVar8 = uVar12 + 1;
                            uVar12 = uVar11;
                          } while (piVar3[lVar8] != piVar3[uVar7]);
                          bVar19 = uVar11 < uVar1;
                        }
                      }
LAB_00297cab:
                      if ((uint)uVar11 != uVar1) {
                        if (!bVar19) {
                          p_00->nSize = iVar2;
LAB_00297de2:
                          __assert_fail("i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
                        }
                        uVar5 = (uint)uVar11 + 1;
                        if ((int)uVar5 < (int)uVar1) {
                          piVar6 = piVar3 + uVar5;
                          do {
                            iVar2 = (int)uVar11;
                            piVar3[uVar11 & 0xffffffff] = *piVar6;
                            piVar6 = piVar6 + 1;
                            uVar11 = (ulong)(iVar2 + 1);
                          } while (iVar2 + 2 < (int)uVar1);
                        }
                        p->nSize = uVar1 - 1;
                      }
                      iVar18 = iVar18 + -1;
                      goto LAB_00297cf2;
                    }
                  }
                  p_00->nSize = iVar2;
                  goto LAB_00297db5;
                }
LAB_00297cf2:
                uVar7 = (ulong)(iVar18 + 1U);
                pVVar4 = iMatch[lVar17];
              } while ((int)(iVar18 + 1U) < pVVar4->nSize);
            }
            iVar15 = iVar15 + 1;
            lVar16 = lVar16 + -1;
          } while (iVar15 != iVar9 + -1);
        }
        p_00->nSize = (int)lVar16;
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
        if (p_00->pArray != (int *)0x0) {
          free(p_00->pArray);
          p_00->pArray = (int *)0x0;
        }
        free(p_00);
      }
      lVar17 = lVar17 + 1;
      iVar9 = *iLastItem;
    } while (lVar17 < iVar9);
  }
  *iLastItem = iVar9 + iVar15;
  return iVar15;
}

Assistant:

int iSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** iMatch, int* iGroup, int* iLastItem, int* oGroup)
{
    int i, j, k;    
    int numOfItemsAdded = 0;
    Vec_Int_t * array, * sortedArray;    

    for(i = 0; i < *iLastItem; i++)
    {
        if(Vec_IntSize(iMatch[i]) == 1)
            continue;
        
        array = Vec_IntAlloc( Vec_IntSize(iMatch[i]) );
        sortedArray = Vec_IntAlloc( Vec_IntSize(iMatch[i]) );

        for(j = 0; j < Vec_IntSize(iMatch[i]); j++)
        {        
            int factor, encode;

            encode = 0;
            factor = 1;    
            
            for(k = 0; k < Vec_IntSize(iDep[Vec_IntEntry(iMatch[i], j)]); k++)                            
                encode += oGroup[Vec_IntEntry(iDep[Vec_IntEntry(iMatch[i], j)], k)] * factor;                        

            Vec_IntPush(array, encode);
            Vec_IntPushUniqueOrder(sortedArray, encode);
            
            //printf("%d ", Vec_IntEntry(array, j));
        }            
                
        while( Vec_IntSize(sortedArray) > 1 )
        {            
            for(k = 0; k < Vec_IntSize(iMatch[i]); k++) 
            {
                if(Vec_IntEntry(array, k) == Vec_IntEntryLast(sortedArray))
                {
                    Vec_IntPush(iMatch[*iLastItem+numOfItemsAdded], Vec_IntEntry(iMatch[i], k));
                    iGroup[Vec_IntEntry(iMatch[i], k)] = *iLastItem+numOfItemsAdded;
                    Vec_IntRemove( iMatch[i], Vec_IntEntry(iMatch[i], k) );                            
                    Vec_IntRemove( array, Vec_IntEntry(array, k) );    
                    k--;
                }
            }
            numOfItemsAdded++;
            Vec_IntPop(sortedArray);    
        }

        Vec_IntFree( array );        
        Vec_IntFree( sortedArray );    
        //printf("\n");
    }    

    *iLastItem += numOfItemsAdded;

    /*printf("\n");
    for(j = 0; j < *iLastItem ; j++)
    {
        printf("iMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(iMatch[j]); i++)
            printf("%d ", Vec_IntEntry(iMatch[j], i));
        printf("\n");
    }*/

    return numOfItemsAdded;    
}